

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_index_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateIndexInfo::ExpressionsToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateIndexInfo *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  allocator local_41;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_40;
  string local_28;
  
  ExpressionsToList_abi_cxx11_(&local_40,this);
  ::std::__cxx11::string::string((string *)&local_28,", ",&local_41);
  StringUtil::Join(__return_storage_ptr__,&local_40,&local_28);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string CreateIndexInfo::ExpressionsToString() const {
	auto list = ExpressionsToList();
	return StringUtil::Join(list, ", ");
}